

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O3

void cod_ev_discard_and_submit_rel(cod_exec_context ec,int port,int queue,int index)

{
  uint uVar1;
  CManager_conflict cm;
  EVstone EVar2;
  ev_state_data *peVar3;
  queue_item *item;
  
  peVar3 = (ev_state_data *)cod_get_client_data(ec,0x34567890);
  EVar2 = port_to_stone(peVar3,port);
  if (EVar2 == -1) {
    uVar1 = peVar3->stone;
  }
  else {
    peVar3 = (ev_state_data *)cod_get_client_data(ec,0x34567890);
    cm = peVar3->cm;
    EVar2 = port_to_stone(peVar3,port);
    if (EVar2 != -1) {
      item = cod_find_index_rel(peVar3,queue,index);
      if (item != (queue_item *)0x0) {
        item->handled = 0;
        internal_path_submit(cm,EVar2,item->item);
        peVar3->did_output = peVar3->did_output + 1;
        EVdiscard_queue_item(cm,peVar3->stone,item);
        return;
      }
      printf("Item %x not found on queue %d, stone %d\n",(ulong)(uint)index,(ulong)(uint)queue,
             (ulong)(uint)peVar3->stone);
      return;
    }
    uVar1 = peVar3->stone;
  }
  printf("Port %d on stone %d invalid\n",(ulong)(uint)port,(ulong)uVar1);
  return;
}

Assistant:

static void cod_ev_discard_and_submit_rel(cod_exec_context ec, int port, int queue,
        int index) {
    struct ev_state_data *ev_state = (void*) cod_get_client_data(ec, 0x34567890);
    EVstone target_stone = port_to_stone(ev_state, port);
    if (target_stone == -1) {
        printf("Port %d on stone %d invalid\n", port, ev_state->stone);
	return;
    }

    cod_ev_discard_and_submit(ec, 0, port, queue, index);
}